

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

bool Validator::constraintH3(Solution *solution)

{
  pointer pcVar1;
  Turn *this;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  pointer ppTVar5;
  _Rb_tree_node_base *p_Var6;
  int iVar7;
  int iVar8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__x;
  vector<Turn_*,_std::allocator<Turn_*>_> *__x_00;
  Nurse *this_00;
  History *this_01;
  string *psVar9;
  Scenario *pSVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *pmVar11;
  mapped_type *pmVar12;
  ShiftType *pSVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  pointer ppTVar16;
  bool bVar17;
  string lastShiftString;
  ShiftType lastShift;
  vector<Turn_*,_std::allocator<Turn_*>_> turns;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  nurses;
  key_type local_e0;
  ShiftType local_c0;
  vector<Turn_*,_std::allocator<Turn_*>_> local_80;
  _Rb_tree_node_base *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  local_60;
  
  __x = &Solution::getNurses_abi_cxx11_(solution)->_M_t;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  ::_Rb_tree(&local_60,__x);
  bVar17 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
           &local_60._M_impl.super__Rb_tree_header;
  do {
    if (bVar17) {
LAB_001136c7:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
      ::~_Rb_tree(&local_60);
      return bVar17;
    }
    __x_00 = NurseSolution::getTurns
                       (*(NurseSolution **)
                         (local_60._M_impl.super__Rb_tree_header._M_header._M_left + 2));
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector(&local_80,__x_00);
    local_68 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    this_00 = NurseSolution::getNurse
                        (*(NurseSolution **)
                          (local_60._M_impl.super__Rb_tree_header._M_header._M_left + 2));
    this_01 = Nurse::getHistory(this_00);
    psVar9 = History::getLastAssignedShiftType_abi_cxx11_(this_01);
    pcVar1 = (psVar9->_M_dataplus)._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + psVar9->_M_string_length);
    local_c0.id._M_string_length = 0;
    local_c0.id.field_2._M_local_buf[0] = '\0';
    local_c0.forbiddenSucceedingShiftTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c0.forbiddenSucceedingShiftTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0.forbiddenSucceedingShiftTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0.id._M_dataplus._M_p = (pointer)&local_c0.id.field_2;
    pSVar10 = Scenario::getInstance();
    pmVar11 = Scenario::getShifts_abi_cxx11_(pSVar10);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
              ::at(pmVar11,&local_e0);
    std::__cxx11::string::_M_assign((string *)&local_c0);
    local_c0.minimumNumberOfConsecutiveAssignments = pmVar12->minimumNumberOfConsecutiveAssignments;
    local_c0.maximumNumberOfConsecutiveAssignments = pmVar12->maximumNumberOfConsecutiveAssignments;
    iVar8 = -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_c0.forbiddenSucceedingShiftTypes,&pmVar12->forbiddenSucceedingShiftTypes);
    ppTVar5 = local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar16 = local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppTVar16 != ppTVar5; ppTVar16 = ppTVar16 + 1)
    {
      this = *ppTVar16;
      if (iVar8 == -2) {
        pSVar10 = Scenario::getInstance();
        pmVar11 = Scenario::getShifts_abi_cxx11_(pSVar10);
        pSVar13 = Turn::getShiftType(this);
        psVar9 = ShiftType::getId_abi_cxx11_(pSVar13);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                  ::at(pmVar11,psVar9);
        std::__cxx11::string::_M_assign((string *)&local_c0);
LAB_00113587:
        local_c0.minimumNumberOfConsecutiveAssignments =
             pmVar12->minimumNumberOfConsecutiveAssignments;
        local_c0.maximumNumberOfConsecutiveAssignments =
             pmVar12->maximumNumberOfConsecutiveAssignments;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_c0.forbiddenSucceedingShiftTypes,&pmVar12->forbiddenSucceedingShiftTypes)
        ;
        iVar8 = Turn::getDay(this);
        bVar4 = true;
      }
      else {
        pvVar14 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&local_c0);
        pbVar2 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar14 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&local_c0);
        pbVar3 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pSVar13 = Turn::getShiftType(this);
        psVar9 = ShiftType::getId_abi_cxx11_(pSVar13);
        _Var15 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (pbVar2,pbVar3,psVar9);
        pvVar14 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&local_c0);
        if ((_Var15._M_current ==
             (pvVar14->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) ||
           (iVar7 = Turn::getDay(this), iVar8 != iVar7 + -1)) {
          pSVar10 = Scenario::getInstance();
          pmVar11 = Scenario::getShifts_abi_cxx11_(pSVar10);
          pSVar13 = Turn::getShiftType(this);
          psVar9 = ShiftType::getId_abi_cxx11_(pSVar13);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                    ::at(pmVar11,psVar9);
          std::__cxx11::string::_M_assign((string *)&local_c0);
          goto LAB_00113587;
        }
        bVar4 = false;
      }
      if (!bVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c0.forbiddenSucceedingShiftTypes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.id._M_dataplus._M_p != &local_c0.id.field_2) {
          operator_delete(local_c0.id._M_dataplus._M_p,
                          CONCAT71(local_c0.id.field_2._M_allocated_capacity._1_7_,
                                   local_c0.id.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        goto LAB_001136c7;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0.forbiddenSucceedingShiftTypes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.id._M_dataplus._M_p != &local_c0.id.field_2) {
      operator_delete(local_c0.id._M_dataplus._M_p,
                      CONCAT71(local_c0.id.field_2._M_allocated_capacity._1_7_,
                               local_c0.id.field_2._M_local_buf[0]) + 1);
    }
    p_Var6 = local_68;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    bVar17 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
             &local_60._M_impl.super__Rb_tree_header;
  } while( true );
}

Assistant:

bool Validator::constraintH3(const Solution &solution) {
    map<string, NurseSolution *> nurses = solution.getNurses();
    for(auto const &nurse : nurses)
    {
        vector<Turn *> turns = nurse.second->getTurns();

        string lastShiftString = nurse.second->getNurse()->getHistory().getLastAssignedShiftType();

        int lastDay;
        ShiftType lastShift;

        try {

            lastShift = Scenario::getInstance()->getShifts().at(lastShiftString);
            lastDay = -1;
        }
        catch(const std::exception& e)
        {
            lastDay = -2;
        }

        for(Turn * turn : turns){
            if(lastDay == -2) {
                lastShift = Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId());
                lastDay = turn->getDay();
            }
            else if(find(lastShift.getForbiddenSucceedingShiftTypes().begin(), lastShift.getForbiddenSucceedingShiftTypes().end(), turn->getShiftType()->getId()) == lastShift.getForbiddenSucceedingShiftTypes().end()
               || lastDay != (turn->getDay() - 1)){
                lastShift = Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId());
                lastDay = turn->getDay();
            }
            else
            {
                return false;
            }
        }
    }
    return true;
}